

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O0

uchar * Cnf_DataDeriveLitPolarities(Cnf_Dat_t *p)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *__ptr;
  void *__ptr_00;
  uchar *puVar6;
  uchar *pPres;
  uint *pPols1;
  uint *pPols0;
  int *pLit;
  int iClaEnd;
  int iClaBeg;
  int c;
  int i;
  Cnf_Dat_t *p_local;
  
  iVar2 = Aig_ManObjNumMax(p->pMan);
  __ptr = calloc((long)iVar2,4);
  iVar2 = Aig_ManObjNumMax(p->pMan);
  __ptr_00 = calloc((long)iVar2,4);
  puVar6 = (uchar *)calloc((long)p->nClauses,1);
  for (iClaBeg = 0; iVar2 = Aig_ManObjNumMax(p->pMan), iClaBeg < iVar2; iClaBeg = iClaBeg + 1) {
    if (p->pObj2Count[iClaBeg] != 0) {
      iVar3 = p->pObj2Clause[iClaBeg] + p->pObj2Count[iClaBeg];
      iVar2 = p->pObj2Clause[iClaBeg];
      for (iClaEnd = iVar2; iVar4 = iVar2, iClaEnd < iVar3; iClaEnd = iClaEnd + 1) {
        pPols0 = (uint *)p->pClauses[iClaEnd];
        while (pPols0 = pPols0 + 1, pPols0 < p->pClauses[iClaEnd + 1]) {
          iVar4 = Abc_LitIsCompl(*p->pClauses[iClaEnd]);
          if (iVar4 == 0) {
            iVar4 = Abc_LitIsCompl(*pPols0);
            iVar5 = Abc_Lit2Var(*pPols0);
            *(uint *)((long)__ptr_00 + (long)iVar5 * 4) =
                 2U - iVar4 | *(uint *)((long)__ptr_00 + (long)iVar5 * 4);
          }
          else {
            iVar4 = Abc_LitIsCompl(*pPols0);
            iVar5 = Abc_Lit2Var(*pPols0);
            *(uint *)((long)__ptr + (long)iVar5 * 4) =
                 2U - iVar4 | *(uint *)((long)__ptr + (long)iVar5 * 4);
          }
        }
      }
      while (iClaEnd = iVar4, iClaEnd < iVar3) {
        pPols0 = (uint *)p->pClauses[iClaEnd];
        while (pPols0 = pPols0 + 1, pPols0 < p->pClauses[iClaEnd + 1]) {
          iVar4 = Abc_LitIsCompl(*p->pClauses[iClaEnd]);
          if (iVar4 == 0) {
            bVar1 = puVar6[iClaEnd];
            iVar4 = Abc_Lit2Var(*pPols0);
            puVar6[iClaEnd] =
                 bVar1 | (byte)(*(int *)((long)__ptr_00 + (long)iVar4 * 4) <<
                               (((char)((long)pPols0 - (long)p->pClauses[iClaEnd] >> 2) + -1) *
                                '\x02' & 0x1fU));
          }
          else {
            bVar1 = puVar6[iClaEnd];
            iVar4 = Abc_Lit2Var(*pPols0);
            puVar6[iClaEnd] =
                 bVar1 | (byte)(*(int *)((long)__ptr + (long)iVar4 * 4) <<
                               (((char)((long)pPols0 - (long)p->pClauses[iClaEnd] >> 2) + -1) *
                                '\x02' & 0x1fU));
          }
        }
        iVar4 = iClaEnd + 1;
      }
      while (iClaEnd = iVar2, iClaEnd < iVar3) {
        pPols0 = (uint *)p->pClauses[iClaEnd];
        while (pPols0 = pPols0 + 1, pPols0 < p->pClauses[iClaEnd + 1]) {
          iVar2 = Abc_Lit2Var(*pPols0);
          *(undefined4 *)((long)__ptr_00 + (long)iVar2 * 4) = 0;
          iVar2 = Abc_Lit2Var(*pPols0);
          *(undefined4 *)((long)__ptr + (long)iVar2 * 4) = 0;
        }
        iVar2 = iClaEnd + 1;
      }
    }
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  return puVar6;
}

Assistant:

unsigned char * Cnf_DataDeriveLitPolarities( Cnf_Dat_t * p )
{
    int i, c, iClaBeg, iClaEnd, * pLit;
    unsigned * pPols0 = ABC_CALLOC( unsigned, Aig_ManObjNumMax(p->pMan) );
    unsigned * pPols1 = ABC_CALLOC( unsigned, Aig_ManObjNumMax(p->pMan) );
    unsigned char * pPres = ABC_CALLOC( unsigned char, p->nClauses );
    for ( i = 0; i < Aig_ManObjNumMax(p->pMan); i++ )
    {
        if ( p->pObj2Count[i] == 0 )
            continue;
        iClaBeg = p->pObj2Clause[i];
        iClaEnd = p->pObj2Clause[i] + p->pObj2Count[i];
        // go through the negative polarity clauses
        for ( c = iClaBeg; c < iClaEnd; c++ )
            for ( pLit = p->pClauses[c]+1; pLit < p->pClauses[c+1]; pLit++ )
                if ( Abc_LitIsCompl(p->pClauses[c][0]) )
                    pPols0[Abc_Lit2Var(*pLit)] |= (unsigned)(2 - Abc_LitIsCompl(*pLit));  // taking the opposite (!) -- not the case
                else
                    pPols1[Abc_Lit2Var(*pLit)] |= (unsigned)(2 - Abc_LitIsCompl(*pLit));  // taking the opposite (!) -- not the case
        // record these clauses
        for ( c = iClaBeg; c < iClaEnd; c++ )
            for ( pLit = p->pClauses[c]+1; pLit < p->pClauses[c+1]; pLit++ )
                if ( Abc_LitIsCompl(p->pClauses[c][0]) )
                    pPres[c] = (unsigned char)( (unsigned)pPres[c] | (pPols0[Abc_Lit2Var(*pLit)] << (2*(pLit-p->pClauses[c]-1))) );
                else
                    pPres[c] = (unsigned char)( (unsigned)pPres[c] | (pPols1[Abc_Lit2Var(*pLit)] << (2*(pLit-p->pClauses[c]-1))) );
        // clean negative polarity
        for ( c = iClaBeg; c < iClaEnd; c++ )
            for ( pLit = p->pClauses[c]+1; pLit < p->pClauses[c+1]; pLit++ )
                pPols0[Abc_Lit2Var(*pLit)] = pPols1[Abc_Lit2Var(*pLit)] = 0;
    }
    ABC_FREE( pPols0 );
    ABC_FREE( pPols1 );
/*
//    for ( c = 0; c < p->nClauses; c++ )
    for ( c = 0; c < 100; c++ )
    {
        printf( "Clause %6d : ", c );
        for ( i = 0; i < 4; i++ )
            printf( "%d ", ((unsigned)pPres[c] >> (2*i)) & 3 );
        printf( "  " );
        for ( pLit = p->pClauses[c]; pLit < p->pClauses[c+1]; pLit++ )
            printf( "%6d ", *pLit );
        printf( "\n" );
    }
*/
    return pPres;
}